

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_info.c
# Opt level: O1

double inform_active_info(int *series,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  _Bool _Var9;
  ulong uVar10;
  ulong uVar11;
  void *__ptr;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  size_t sVar18;
  long lVar19;
  int future;
  ulong uVar20;
  void *pvVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  undefined1 auVar25 [16];
  
  _Var9 = check_arguments(series,n,m,b,k,err);
  dVar6 = NAN;
  if (!_Var9) {
    auVar25._8_4_ = (int)(k >> 0x20);
    auVar25._0_8_ = k;
    auVar25._12_4_ = 0x45300000;
    dVar6 = pow((double)b,
                (auVar25._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    dVar6 = dVar6 * (double)b;
    uVar10 = (ulong)dVar6;
    uVar10 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
    uVar11 = uVar10 / (ulong)(long)b;
    __ptr = calloc((long)b + uVar10 + uVar11,4);
    if (__ptr == (void *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      dVar6 = NAN;
    }
    else {
      lVar13 = (m - k) * n;
      lVar8 = uVar11 * 4 + uVar10 * 4;
      if (n != 0) {
        sVar14 = 0;
        do {
          if (k == 0) {
            iVar15 = 1;
            iVar16 = 0;
          }
          else {
            sVar18 = 0;
            iVar15 = 1;
            iVar16 = 0;
            do {
              iVar15 = iVar15 * b;
              iVar16 = iVar16 * b + series[sVar18];
              sVar18 = sVar18 + 1;
            } while (k != sVar18);
          }
          if (k < m) {
            lVar19 = 0;
            do {
              iVar2 = series[k + lVar19];
              lVar17 = (long)(iVar16 * b) + (long)iVar2;
              piVar1 = (int *)((long)__ptr + lVar17 * 4);
              *piVar1 = *piVar1 + 1;
              piVar1 = (int *)((long)__ptr + (long)iVar16 * 4 + uVar10 * 4);
              *piVar1 = *piVar1 + 1;
              piVar1 = (int *)((long)__ptr + (long)iVar2 * 4 + lVar8);
              *piVar1 = *piVar1 + 1;
              iVar16 = (int)lVar17 - series[lVar19] * iVar15;
              lVar19 = lVar19 + 1;
            } while (m - k != lVar19);
          }
          sVar14 = sVar14 + 1;
          series = series + m;
        } while (sVar14 != n);
      }
      uVar22 = (undefined4)lVar13;
      uVar23 = (undefined4)((ulong)lVar13 >> 0x20);
      if ((int)(uint)uVar11 < 1) {
        dVar6 = 0.0;
      }
      else {
        dVar6 = 0.0;
        uVar12 = 0;
        pvVar21 = __ptr;
        do {
          uVar3 = *(uint *)((long)__ptr + uVar12 * 4 + uVar10 * 4);
          if (uVar3 != 0 && 0 < b) {
            uVar20 = 0;
            do {
              uVar4 = *(uint *)((long)__ptr + uVar20 * 4 + lVar8);
              if ((uVar4 != 0) && (uVar5 = *(uint *)((long)pvVar21 + uVar20 * 4), uVar5 != 0)) {
                dVar24 = (double)uVar5;
                dVar7 = log2(((((double)CONCAT44(0x45300000,uVar23) - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0)) * dVar24)
                             / ((double)uVar4 * (double)uVar3));
                dVar6 = dVar6 + dVar7 * dVar24;
              }
              uVar20 = uVar20 + 1;
            } while ((uint)b != uVar20);
          }
          uVar12 = uVar12 + 1;
          pvVar21 = (void *)((long)pvVar21 + (ulong)(uint)b * 4);
        } while (uVar12 < ((uint)uVar11 & 0x7fffffff));
      }
      free(__ptr);
      dVar6 = dVar6 / (((double)CONCAT44(0x45300000,uVar23) - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0));
    }
  }
  return dVar6;
}

Assistant:

double inform_active_info(int const *series, size_t n, size_t m, int b,
    size_t k, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NAN;

    size_t const N = n * (m - k);

    size_t const states_size = (size_t) (b * pow((double) b,(double) k));
    size_t const histories_size = states_size / b;
    size_t const futures_size = b;
    size_t const total_size = states_size + histories_size + futures_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist states    = { data, states_size, N };
    inform_dist histories = { data + states_size, histories_size, N };
    inform_dist futures   = { data + states_size + histories_size, futures_size, N };

    accumulate_observations(series, n, m, b, k, &states, &histories, &futures);

    double ai = 0.0;
    int state;
    double n_state, n_history, n_future;
    for (int history = 0; history < (int) histories_size; ++history)
    {
        n_history = histories.histogram[history];
        if (n_history == 0)
        {
            continue;
        }
        for (int future = 0; future < b; ++future)
        {
            n_future = futures.histogram[future];
            if (n_future == 0)
            {
                continue;
            }
            state = history * b + future;
            n_state = states.histogram[state];
            if (n_state == 0)
            {
                continue;
            }
            ai += n_state * log2((N * n_state) / (n_history * n_future));
        }
    }

    free(data);

    return ai / N;
}